

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O0

void llb_build_key_get_custom_task_name(llb_build_key_t *key,llb_data_t *out_name)

{
  BuildKey *this;
  char *pcVar1;
  string local_50;
  undefined1 local_30 [8];
  StringRef name;
  llb_data_t *out_name_local;
  llb_build_key_t *key_local;
  
  name.Length = (size_t)out_name;
  this = anon_unknown.dwarf_1e10c2::CAPIBuildKey::getInternalBuildKey((CAPIBuildKey *)key);
  _local_30 = llbuild::buildsystem::BuildKey::getCustomTaskName(this);
  *(char **)name.Length = name.Data;
  llvm::StringRef::str_abi_cxx11_(&local_50,(StringRef *)local_30);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strdup(pcVar1);
  *(char **)(name.Length + 8) = pcVar1;
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void llb_build_key_get_custom_task_name(llb_build_key_t *key, llb_data_t *out_name) {
  auto name = ((CAPIBuildKey *)key)->getInternalBuildKey().getCustomTaskName();
  out_name->length = name.size();
  out_name->data = (const uint8_t*)strdup(name.str().c_str());
}